

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O0

void __thiscall
afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
defer_event<vending::events::load_goods>
          (state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
           *this,load_goods *event)

{
  value_type local_50;
  id_type *local_48;
  anon_class_24_2_480399db local_40;
  size_t local_28;
  load_goods evt;
  load_goods *event_local;
  state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  *this_local;
  
  evt._8_8_ = event;
  detail::null_observer::
  defer_event<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::events::load_goods>
            ((null_observer *)this,this,event);
  local_40.evt.p_no = *(size_t *)evt._8_8_;
  local_40.evt._8_8_ = *(size_t *)(evt._8_8_ + 8);
  local_48 = (id_type *)&detail::event<vending::events::load_goods>::id;
  local_40.this = this;
  local_28 = local_40.evt.p_no;
  evt.p_no = local_40.evt._8_8_;
  std::__cxx11::
  list<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
  ::
  emplace_back<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>::defer_event<vending::events::load_goods>(vending::events::load_goods&&)::_lambda()_1_,afsm::detail::event_base::id_type_const*>
            ((list<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
              *)&this->deferred_events_,&local_40,&local_48);
  local_50 = (value_type)&detail::event<vending::events::load_goods>::id;
  std::
  set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::insert(&this->deferred_event_ids_,&local_50);
  return;
}

Assistant:

void
    defer_event(Event&& event)
    {
        using evt_identity = typename detail::event_identity<Event>::type;

        observer_wrapper::defer_event(*this, ::std::forward<Event>(event));
        Event evt{::std::forward<Event>(event)};
        deferred_events_.emplace_back([&, evt]() mutable {
            return process_event_dispatch(::std::move(evt));
        }, &evt_identity::id);
        deferred_event_ids_.insert(&evt_identity::id);
    }